

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

int ParseExpBitOr(char **p,aint *nval)

{
  int iVar1;
  uint uVar2;
  uint local_40;
  aint right;
  uint *local_38;
  
  iVar1 = ParseExpBitXor(p,(aint *)&local_40);
  if (iVar1 != 0) {
    uVar2 = local_40;
    local_38 = (uint *)nval;
    while( true ) {
      iVar1 = need(p,"|_");
      if ((iVar1 == 0) && (iVar1 = needa(p,"or",0x7c,(char *)0x0,0,(char *)0x0,0,false), iVar1 == 0)
         ) {
        *local_38 = uVar2;
        return 1;
      }
      iVar1 = ParseExpBitXor(p,&right);
      if (iVar1 == 0) break;
      uVar2 = uVar2 | right;
    }
  }
  return 0;
}

Assistant:

static int ParseExpBitOr(char*& p, aint& nval) {
	aint left, right;
	if (!ParseExpBitXor(p, left)) return 0;
	while (need(p, "|_") || needa(p, "or", '|')) {
		if (!ParseExpBitXor(p, right)) return 0;
		left |= right;
	}
	nval = left;
	return 1;
}